

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O3

void lunasvg::handleTextChunk(SVGTextFragmentIterator begin,SVGTextFragmentIterator end)

{
  char cVar1;
  TextAnchor TVar2;
  Direction DVar3;
  bool bVar4;
  SVGTextFragment *fragment;
  SVGTextFragment *pSVar5;
  SVGTextFragmentIterator SVar6;
  ulong uVar7;
  SVGTextFragment *fragment_2;
  SVGTextFragment *pSVar8;
  SVGTextFragment *fragment_3;
  SVGTextFragment *fragment_4;
  ulong uVar9;
  float fVar10;
  float fVar11;
  Transform lengthAdjustTransform;
  LengthContext lengthContext;
  plutovg_matrix_t local_40;
  LengthContext local_28;
  
  bVar4 = SVGElement::hasAttribute((SVGElement *)(begin._M_current)->element,TextLength);
  if (bVar4) {
    if (begin._M_current == end._M_current) {
      uVar9 = 0;
      fVar11 = 0.0;
    }
    else {
      fVar11 = 0.0;
      uVar9 = 0;
      SVar6._M_current = begin._M_current;
      pSVar8 = (SVGTextFragment *)0x0;
      do {
        pSVar5 = SVar6._M_current;
        fVar11 = fVar11 + pSVar5->width;
        if (pSVar8 != (SVGTextFragment *)0x0) {
          fVar11 = fVar11 + (pSVar5->x - (pSVar8->x + pSVar8->width));
        }
        uVar9 = uVar9 + pSVar5->length;
        SVar6._M_current = pSVar5 + 1;
        pSVar8 = pSVar5;
      } while (pSVar5 + 1 != end._M_current);
    }
    local_28.m_element = (SVGElement *)(begin._M_current)->element;
    local_28.m_units = UserSpaceOnUse;
    fVar10 = LengthContext::valueForLength
                       (&local_28,
                        (Length *)
                        &(((SVGTextPositioningElement *)local_28.m_element)->m_textLength).
                         super_SVGProperty.field_0xc,
                        (((SVGTextPositioningElement *)local_28.m_element)->m_textLength).
                        super_SVGProperty.field_0x9);
    if ((0.0 < fVar10) && (0.0 < fVar11)) {
      cVar1 = ((begin._M_current)->element->m_lengthAdjust).super_SVGProperty.field_0x9;
      if (cVar1 == '\x01') {
        Transform::translated((Transform *)&local_40,(begin._M_current)->x,(begin._M_current)->y);
        Transform::scale((Transform *)&local_40,fVar10 / fVar11,1.0);
        Transform::translate((Transform *)&local_40,-(begin._M_current)->x,-(begin._M_current)->y);
        SVar6._M_current = begin._M_current;
        if (begin._M_current != end._M_current) {
          do {
            ((SVar6._M_current)->lengthAdjustTransform).m_matrix.e = local_40.e;
            ((SVar6._M_current)->lengthAdjustTransform).m_matrix.f = local_40.f;
            ((SVar6._M_current)->lengthAdjustTransform).m_matrix.a = local_40.a;
            ((SVar6._M_current)->lengthAdjustTransform).m_matrix.b = local_40.b;
            ((SVar6._M_current)->lengthAdjustTransform).m_matrix.c = local_40.c;
            ((SVar6._M_current)->lengthAdjustTransform).m_matrix.d = local_40.d;
            SVar6._M_current = SVar6._M_current + 1;
          } while (SVar6._M_current != end._M_current);
        }
      }
      else if (1 < uVar9) {
        if (cVar1 != '\0') {
          __assert_fail("firstFragment.element->lengthAdjust() == LengthAdjust::Spacing",
                        "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgtextelement.cpp"
                        ,0xa5,
                        "void lunasvg::handleTextChunk(SVGTextFragmentIterator, SVGTextFragmentIterator)"
                       );
        }
        if (begin._M_current != end._M_current) {
          uVar7 = 0;
          SVar6._M_current = begin._M_current;
          do {
            (SVar6._M_current)->x =
                 (float)uVar7 * ((fVar10 - fVar11) / (float)(uVar9 - 1)) + (SVar6._M_current)->x;
            uVar7 = uVar7 + (SVar6._M_current)->length;
            SVar6._M_current = SVar6._M_current + 1;
          } while (SVar6._M_current != end._M_current);
        }
      }
    }
  }
  TVar2 = (begin._M_current)->element->m_text_anchor;
  DVar3 = (begin._M_current)->element->m_direction;
  if (TVar2 == Start) {
    if (DVar3 != Rtl) {
      return;
    }
  }
  else if (TVar2 != Middle) {
    if (TVar2 != End) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgtextelement.cpp"
                    ,0x6b,
                    "bool lunasvg::needsTextAnchorAdjustment(const SVGTextPositioningElement *)");
    }
    if (DVar3 != Ltr) {
      return;
    }
  }
  fVar11 = 0.0;
  if (begin._M_current != end._M_current) {
    SVar6._M_current = begin._M_current;
    pSVar8 = (SVGTextFragment *)0x0;
    do {
      pSVar5 = SVar6._M_current;
      fVar11 = fVar11 + pSVar5->width;
      if (pSVar8 != (SVGTextFragment *)0x0) {
        fVar11 = fVar11 + (pSVar5->x - (pSVar8->x + pSVar8->width));
      }
      SVar6._M_current = pSVar5 + 1;
      pSVar8 = pSVar5;
    } while (pSVar5 + 1 != end._M_current);
  }
  if (TVar2 == End) {
    fVar10 = 0.0;
    if (DVar3 != Ltr) goto LAB_00121b10;
  }
  else {
    if (TVar2 == Middle) {
      fVar10 = fVar11 * -0.5;
      goto LAB_00121b10;
    }
    if (TVar2 != Start) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgtextelement.cpp"
                    ,0x80,
                    "float lunasvg::calculateTextAnchorOffset(const SVGTextPositioningElement *, float)"
                   );
    }
    if (DVar3 == Ltr) {
      fVar10 = 0.0;
      goto LAB_00121b10;
    }
  }
  fVar10 = -fVar11;
LAB_00121b10:
  for (; begin._M_current != end._M_current; begin._M_current = begin._M_current + 1) {
    (begin._M_current)->x = (begin._M_current)->x + fVar10;
  }
  return;
}

Assistant:

static void handleTextChunk(SVGTextFragmentIterator begin, SVGTextFragmentIterator end)
{
    const SVGTextFragment& firstFragment = *begin;
    if(firstFragment.element->hasAttribute(PropertyID::TextLength)) {
        float chunkWidth = 0;
        size_t numCharacters = 0;
        const SVGTextFragment* lastFragment = nullptr;
        for(auto it = begin; it != end; ++it) {
            const SVGTextFragment& fragment = *it;
            numCharacters += fragment.length;
            chunkWidth += fragment.width;
            if(lastFragment)
                chunkWidth += fragment.x - (lastFragment->x + lastFragment->width);
            lastFragment = &fragment;
        }

        LengthContext lengthContext(firstFragment.element);
        auto textLength = lengthContext.valueForLength(firstFragment.element->textLength());
        if(textLength > 0.f && chunkWidth > 0.f) {
            if(firstFragment.element->lengthAdjust() == LengthAdjust::SpacingAndGlyphs) {
                auto textLengthScale = textLength / chunkWidth;
                auto lengthAdjustTransform = Transform::translated(firstFragment.x, firstFragment.y);
                lengthAdjustTransform.scale(textLengthScale, 1.f);
                lengthAdjustTransform.translate(-firstFragment.x, -firstFragment.y);
                for(auto it = begin; it != end; ++it) {
                    SVGTextFragment& fragment = *it;
                    fragment.lengthAdjustTransform = lengthAdjustTransform;
                }
            } else if(numCharacters > 1) {
                assert(firstFragment.element->lengthAdjust() == LengthAdjust::Spacing);
                size_t characterOffset = 0;
                auto textLengthShift = (textLength - chunkWidth) / (numCharacters - 1);
                for(auto it = begin; it != end; ++it) {
                    SVGTextFragment& fragment = *it;
                    fragment.x += textLengthShift * characterOffset;
                    characterOffset += fragment.length;
                }
            }
        }
    }

    if(needsTextAnchorAdjustment(firstFragment.element)) {
        float chunkWidth = 0;
        const SVGTextFragment* lastFragment = nullptr;
        for(auto it = begin; it != end; ++it) {
            const SVGTextFragment& fragment = *it;
            chunkWidth += fragment.width;
            if(lastFragment)
                chunkWidth += fragment.x - (lastFragment->x + lastFragment->width);
            lastFragment = &fragment;
        }

        auto chunkOffset = calculateTextAnchorOffset(firstFragment.element, chunkWidth);
        for(auto it = begin; it != end; ++it) {
            SVGTextFragment& fragment = *it;
            fragment.x += chunkOffset;
        }
    }
}